

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphanage::newOrphan
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphanage *this,ListSchema schema,
          uint size)

{
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  Which elementType;
  StructSchema schema_00;
  ElementSize elementSize;
  StructSize elementSize_00;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  undefined8 uVar4;
  undefined4 in_stack_ffffffffffffff98;
  ListSchema schema_local;
  OrphanBuilder local_50;
  
  aVar3 = schema.elementType.field_4;
  uVar4 = schema.elementType._0_8_;
  schema_local.elementType._0_8_ = uVar4;
  schema_local.elementType.field_4.scopeId = aVar3.scopeId;
  if (schema.elementType.baseType == STRUCT &&
      ((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
  {
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    Type::asStruct(&schema_local.elementType);
    schema_00.super_Schema.raw._4_4_ = size;
    schema_00.super_Schema.raw._0_4_ = in_stack_ffffffffffffff98;
    elementSize_00 = anon_unknown_71::structSizeFromSchema(schema_00);
    _::OrphanBuilder::initStructList(&local_50,pBVar1,pCVar2,size,elementSize_00);
  }
  else {
    pBVar1 = this->arena;
    pCVar2 = this->capTable;
    elementType = LIST;
    if (((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0
       ) {
      elementType = schema.elementType.baseType;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    _::OrphanBuilder::initList(&local_50,pBVar1,pCVar2,size,elementSize);
  }
  (__return_storage_ptr__->schema).elementType.baseType = (Which)uVar4;
  (__return_storage_ptr__->schema).elementType.listDepth = SUB81(uVar4,2);
  (__return_storage_ptr__->schema).elementType.isImplicitParam = SUB81(uVar4,3);
  (__return_storage_ptr__->schema).elementType.field_3 = SUB82(uVar4,4);
  *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 = SUB82(uVar4,6);
  (__return_storage_ptr__->schema).elementType.field_4 = aVar3;
  (__return_storage_ptr__->builder).segment = local_50.segment;
  (__return_storage_ptr__->builder).capTable = local_50.capTable;
  (__return_storage_ptr__->builder).location = local_50.location;
  local_50.segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).tag.content = local_50.tag.content;
  local_50.location = (word *)0x0;
  _::OrphanBuilder::~OrphanBuilder(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicList> Orphanage::newOrphan(ListSchema schema, uint size) const {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initStructList(
        arena, capTable, bounded(size) * ELEMENTS,
        structSizeFromSchema(schema.getStructElementType())));
  } else {
    return Orphan<DynamicList>(schema, _::OrphanBuilder::initList(
        arena, capTable, bounded(size) * ELEMENTS,
        elementSizeFor(schema.whichElementType())));
  }
}